

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

void __thiscall cmLinkedTree<cmDefinitions>::Clear(cmLinkedTree<cmDefinitions> *this)

{
  cmLinkedTree<cmDefinitions> *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->UpPositions);
  std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::clear(&this->Data);
  return;
}

Assistant:

void Clear()
  {
    this->UpPositions.clear();
    this->Data.clear();
  }